

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

SocketAddress *
kj::anon_unknown_0::SocketAddress::getLocalAddress(SocketAddress *__return_storage_ptr__,int sockfd)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Fault f;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  memset(__return_storage_ptr__,0,0x88);
  __return_storage_ptr__->addrlen = 0x80;
  do {
    iVar1 = getsockname(sockfd,(sockaddr *)&(__return_storage_ptr__->addr).generic,
                        &__return_storage_ptr__->addrlen);
    if (-1 < iVar1) {
      return (SocketAddress *)CONCAT44(extraout_var,iVar1);
    }
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return (SocketAddress *)CONCAT44(extraout_var_00,iVar1);
  }
  local_30.exception = (Exception *)0x0;
  local_28 = 0;
  uStack_20 = 0;
  kj::_::Debug::Fault::init
            (&local_30,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
            );
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

static SocketAddress getLocalAddress(int sockfd) {
    SocketAddress result;
    result.addrlen = sizeof(addr);
    KJ_SYSCALL(getsockname(sockfd, &result.addr.generic, &result.addrlen));
    return result;
  }